

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O3

quad_value_bit_vector * __thiscall
bsim::andr(quad_value_bit_vector *__return_storage_ptr__,bsim *this,quad_value_bit_vector *a)

{
  quad_value_bit_vector *extraout_RAX;
  quad_value_bit_vector *extraout_RAX_00;
  quad_value_bit_vector *pqVar1;
  quad_value_bit_vector *extraout_RAX_01;
  ulong uVar2;
  string local_30;
  
  if (0 < (int)a) {
    uVar2 = 0;
    do {
      if (this[uVar2] != (bsim)0x1) {
        if (this[uVar2] == (bsim)0x3) {
          __assert_fail("!a.is_high_impedance()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                        ,0x109,"bool bsim::operator!=(const quad_value &, const quad_value &)");
        }
        local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"0","");
        quad_value_bit_vector::quad_value_bit_vector(__return_storage_ptr__,1,&local_30);
        pqVar1 = extraout_RAX_00;
        goto LAB_0013e2a2;
      }
      uVar2 = uVar2 + 1;
    } while (((ulong)a & 0xffffffff) != uVar2);
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"1","");
  quad_value_bit_vector::quad_value_bit_vector(__return_storage_ptr__,1,&local_30);
  pqVar1 = extraout_RAX;
LAB_0013e2a2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
    pqVar1 = extraout_RAX_01;
  }
  return pqVar1;
}

Assistant:

static inline quad_value_bit_vector
  andr(const quad_value_bit_vector& a) {
    for (int i = 0; i < a.bitLength(); i++) {
      if (a.get(i) != 1) {
	return quad_value_bit_vector(1, "0");
      }
    }

    return quad_value_bit_vector(1, "1");
  }